

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  bool bVar1;
  SQFunctionProto *x;
  long lVar2;
  SQLocalVarInfo *this;
  long lVar3;
  SQObjectPtr o;
  SQObjectPtr name_1;
  SQUnsignedInteger local_d8;
  SQObjectPtr name;
  SQObjectPtr sourcename;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQLocalVarInfo lvi;
  SQUnsignedInteger type;
  SQObjectPtr proto;
  
  sourcename.super_SQObject._type = OT_NULL;
  sourcename.super_SQObject._unVal.pTable = (SQTable *)0x0;
  name.super_SQObject._type = OT_NULL;
  name.super_SQObject._unVal.pTable = (SQTable *)0x0;
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = CheckTag(v,read,up,0x50415254);
  if (bVar1) {
    bVar1 = ReadObject(v,up,read,&sourcename);
    if (bVar1) {
      bVar1 = ReadObject(v,up,read,&name);
      if (bVar1) {
        bVar1 = CheckTag(v,read,up,0x50415254);
        if (bVar1) {
          bVar1 = SafeRead(v,read,up,&nliterals,8);
          if (bVar1) {
            bVar1 = SafeRead(v,read,up,&nparameters,8);
            if (bVar1) {
              bVar1 = SafeRead(v,read,up,&noutervalues,8);
              if (bVar1) {
                bVar1 = SafeRead(v,read,up,&nlocalvarinfos,8);
                if (bVar1) {
                  bVar1 = SafeRead(v,read,up,&nlineinfos,8);
                  if (bVar1) {
                    bVar1 = SafeRead(v,read,up,&ndefaultparams,8);
                    if (bVar1) {
                      bVar1 = SafeRead(v,read,up,&ninstructions,8);
                      if (bVar1) {
                        bVar1 = SafeRead(v,read,up,&nfunctions,8);
                        if (bVar1) {
                          x = Create(v->_sharedstate,ninstructions,nliterals,nparameters,nfunctions,
                                     noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
                          SQObjectPtr::SQObjectPtr(&proto,x);
                          SQObjectPtr::operator=(&x->_sourcename,&sourcename);
                          SQObjectPtr::operator=(&x->_name,&name);
                          bVar1 = CheckTag(v,read,up,0x50415254);
                          if (bVar1) {
                            lVar3 = 0;
                            for (lVar2 = 0; lVar2 < nliterals; lVar2 = lVar2 + 1) {
                              bVar1 = ReadObject(v,up,read,&o);
                              if (!bVar1) goto LAB_00153e76;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&(x->_literals->super_SQObject)._type + lVar3),&o);
                              lVar3 = lVar3 + 0x10;
                            }
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            lVar3 = 0;
                            for (lVar2 = 0; lVar2 < nparameters; lVar2 = lVar2 + 1) {
                              bVar1 = ReadObject(v,up,read,&o);
                              if (!bVar1) goto LAB_00153e76;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&(x->_parameters->super_SQObject)._type + lVar3),&o)
                              ;
                              lVar3 = lVar3 + 0x10;
                            }
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            lVar3 = 0;
                            for (lVar2 = 0; lVar2 < noutervalues; lVar2 = lVar2 + 1) {
                              name_1.super_SQObject._type = OT_NULL;
                              name_1.super_SQObject._unVal.pTable = (SQTable *)0x0;
                              bVar1 = SafeRead(v,read,up,&type,8);
                              if (!bVar1) {
LAB_00153e6c:
                                this = (SQLocalVarInfo *)&name_1;
                                goto LAB_00153e71;
                              }
                              bVar1 = ReadObject(v,up,read,&o);
                              if (!bVar1) goto LAB_00153e6c;
                              bVar1 = ReadObject(v,up,read,&name_1);
                              if (!bVar1) goto LAB_00153e6c;
                              SQOuterVar::SQOuterVar
                                        ((SQOuterVar *)&lvi,&name_1,&o,(SQOuterType)type);
                              SQOuterVar::operator=
                                        ((SQOuterVar *)((long)&x->_outervalues->_type + lVar3),
                                         (SQOuterVar *)&lvi);
                              SQOuterVar::~SQOuterVar((SQOuterVar *)&lvi);
                              SQObjectPtr::~SQObjectPtr(&name_1);
                              lVar3 = lVar3 + 0x28;
                            }
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            local_d8 = 0;
                            for (lVar2 = 0; lVar2 < nlocalvarinfos; lVar2 = lVar2 + 1) {
                              lvi._name.super_SQObject._type = OT_NULL;
                              lvi._end_op = 0;
                              lvi._pos = 0;
                              lvi._name.super_SQObject._unVal.pTable = (SQTable *)0x0;
                              lvi._start_op = 0;
                              bVar1 = ReadObject(v,up,read,&lvi._name);
                              if (!bVar1) {
LAB_00153f85:
                                this = &lvi;
LAB_00153e71:
                                SQObjectPtr::~SQObjectPtr(&this->_name);
                                goto LAB_00153e76;
                              }
                              bVar1 = SafeRead(v,read,up,&lvi._pos,8);
                              if (!bVar1) goto LAB_00153f85;
                              bVar1 = SafeRead(v,read,up,&lvi._start_op,8);
                              if (!bVar1) goto LAB_00153f85;
                              bVar1 = SafeRead(v,read,up,&lvi._end_op,8);
                              if (!bVar1) goto LAB_00153f85;
                              SQLocalVarInfo::operator=
                                        ((SQLocalVarInfo *)
                                         ((long)&(x->_localvarinfos->_name).super_SQObject._type +
                                         local_d8),&lvi);
                              SQObjectPtr::~SQObjectPtr(&lvi._name);
                              local_d8 = local_d8 + 0x28;
                            }
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = SafeRead(v,read,up,x->_lineinfos,nlineinfos << 4);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = SafeRead(v,read,up,x->_defaultparams,ndefaultparams << 3);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = SafeRead(v,read,up,x->_instructions,ninstructions << 3);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = CheckTag(v,read,up,0x50415254);
                            if (!bVar1) goto LAB_00153e76;
                            lVar3 = 0;
                            for (lVar2 = 0; lVar2 < nfunctions; lVar2 = lVar2 + 1) {
                              bVar1 = Load(v,up,read,&o);
                              if (!bVar1) goto LAB_00153e76;
                              SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         ((long)&(x->_functions->super_SQObject)._type + lVar3),&o);
                              lVar3 = lVar3 + 0x10;
                            }
                            bVar1 = SafeRead(v,read,up,&x->_stacksize,8);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = SafeRead(v,read,up,&x->_bgenerator,1);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = SafeRead(v,read,up,&x->_varparams,8);
                            if (!bVar1) goto LAB_00153e76;
                            bVar1 = true;
                            SQObjectPtr::operator=(ret,x);
                          }
                          else {
LAB_00153e76:
                            bVar1 = false;
                          }
                          SQObjectPtr::~SQObjectPtr(&proto);
                          goto LAB_00153cea;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_00153cea:
  SQObjectPtr::~SQObjectPtr(&o);
  SQObjectPtr::~SQObjectPtr(&name);
  SQObjectPtr::~SQObjectPtr(&sourcename);
  return bVar1;
}

Assistant:

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    SQInteger i, nliterals,nparameters;
    SQInteger noutervalues ,nlocalvarinfos ;
    SQInteger nlineinfos,ninstructions ,nfunctions,ndefaultparams ;
    SQObjectPtr sourcename, name;
    SQObjectPtr o;
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(ReadObject(v, up, read, sourcename));
    _CHECK_IO(ReadObject(v, up, read, name));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, &nliterals, sizeof(nliterals)));
    _CHECK_IO(SafeRead(v,read,up, &nparameters, sizeof(nparameters)));
    _CHECK_IO(SafeRead(v,read,up, &noutervalues, sizeof(noutervalues)));
    _CHECK_IO(SafeRead(v,read,up, &nlocalvarinfos, sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeRead(v,read,up, &nlineinfos, sizeof(nlineinfos)));
    _CHECK_IO(SafeRead(v,read,up, &ndefaultparams, sizeof(ndefaultparams)));
    _CHECK_IO(SafeRead(v,read,up, &ninstructions, sizeof(ninstructions)));
    _CHECK_IO(SafeRead(v,read,up, &nfunctions, sizeof(nfunctions)));


    SQFunctionProto *f = SQFunctionProto::Create(_opt_ss(v),ninstructions,nliterals,nparameters,
            nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
    SQObjectPtr proto = f; //gets a ref in case of failure
    f->_sourcename = sourcename;
    f->_name = name;

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0;i < nliterals; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_literals[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nparameters; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_parameters[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < noutervalues; i++){
        SQUnsignedInteger type;
        SQObjectPtr name;
        _CHECK_IO(SafeRead(v,read,up, &type, sizeof(SQUnsignedInteger)));
        _CHECK_IO(ReadObject(v, up, read, o));
        _CHECK_IO(ReadObject(v, up, read, name));
        f->_outervalues[i] = SQOuterVar(name,o, (SQOuterType)type);
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nlocalvarinfos; i++){
        SQLocalVarInfo lvi;
        _CHECK_IO(ReadObject(v, up, read, lvi._name));
        _CHECK_IO(SafeRead(v,read,up, &lvi._pos, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._start_op, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._end_op, sizeof(SQUnsignedInteger)));
        f->_localvarinfos[i] = lvi;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_lineinfos, sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_defaultparams, sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_instructions, sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    for(i = 0; i < nfunctions; i++){
        _CHECK_IO(_funcproto(o)->Load(v, up, read, o));
        f->_functions[i] = o;
    }
    _CHECK_IO(SafeRead(v,read,up, &f->_stacksize, sizeof(f->_stacksize)));
    _CHECK_IO(SafeRead(v,read,up, &f->_bgenerator, sizeof(f->_bgenerator)));
    _CHECK_IO(SafeRead(v,read,up, &f->_varparams, sizeof(f->_varparams)));

    ret = f;
    return true;
}